

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::addVisibleFiles
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,QStringList *newFiles)

{
  QModelIndex *pQVar1;
  bool bVar2;
  QFileSystemNode *pQVar3;
  QString *newFile;
  QString *args;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QModelIndex **)&this->field_0x8;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  index((QFileSystemModelPrivate *)local_58,(char *)this,(int)parentNode);
  bVar2 = isHiddenByFilter(this,parentNode,(QModelIndex *)local_58);
  if (!bVar2) {
    QAbstractItemModel::beginInsertRows
              (pQVar1,(int)local_58,(int)(parentNode->visibleChildren).d.size);
  }
  if (parentNode->dirtyChildrenIndex == -1) {
    parentNode->dirtyChildrenIndex = (int)(parentNode->visibleChildren).d.size;
  }
  args = (newFiles->d).ptr;
  for (lVar4 = (newFiles->d).size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    QList<QString>::emplaceBack<QString_const&>(&parentNode->visibleChildren,args);
    pQVar3 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                       (&parentNode->children,args);
    pQVar3->isVisible = true;
    args = args + 1;
  }
  if (!bVar2) {
    QAbstractItemModel::endInsertRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::addVisibleFiles(QFileSystemNode *parentNode, const QStringList &newFiles)
{
    Q_Q(QFileSystemModel);
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);
    if (!indexHidden) {
        q->beginInsertRows(parent, parentNode->visibleChildren.size() , parentNode->visibleChildren.size() + newFiles.size() - 1);
    }

    if (parentNode->dirtyChildrenIndex == -1)
        parentNode->dirtyChildrenIndex = parentNode->visibleChildren.size();

    for (const auto &newFile : newFiles) {
        parentNode->visibleChildren.append(newFile);
        parentNode->children.value(newFile)->isVisible = true;
    }
    if (!indexHidden)
      q->endInsertRows();
}